

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O1

_Bool array_run_container_intersect(array_container_t *src_1,run_container_t *src_2)

{
  int iVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  rle16_t *prVar5;
  uint16_t *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  _Bool _Var16;
  
  prVar5 = src_2->runs;
  uVar13 = (uint)prVar5->value;
  iVar3 = src_2->n_runs;
  _Var16 = iVar3 == 1;
  if ((prVar5->value == 0 && _Var16) && (prVar5->length == 0xffff)) {
    _Var16 = src_1->cardinality != 0;
  }
  else {
    lVar11 = 0;
    if (iVar3 == 0) {
LAB_0011ed35:
      _Var16 = false;
    }
    else {
      uVar14 = (uint)prVar5->length;
      iVar4 = src_1->cardinality;
      iVar8 = 0;
      do {
        if (iVar4 <= iVar8) goto LAB_0011ed35;
        puVar6 = src_1->array;
        uVar2 = puVar6[iVar8];
        if (uVar14 + uVar13 < (uint)uVar2) {
          lVar11 = (long)(int)lVar11;
          do {
            lVar11 = lVar11 + 1;
            if (iVar3 == (int)lVar11) {
              _Var16 = false;
              goto LAB_0011ece9;
            }
            uVar13 = (uint)prVar5[lVar11].value;
            uVar14 = (uint)prVar5[lVar11].length;
          } while (uVar13 + uVar14 < (uint)uVar2);
        }
        uVar12 = (ushort)uVar13;
        if (uVar2 < uVar12) {
          iVar1 = iVar8 + 1;
          bVar7 = true;
          iVar10 = iVar1;
          if ((iVar1 < iVar4) && (puVar6[iVar1] < uVar12)) {
            iVar8 = iVar8 + 2;
            iVar15 = 0;
            iVar9 = iVar4 + -1;
            if (iVar8 < iVar4) {
              iVar10 = 1;
              do {
                iVar9 = iVar8;
                iVar15 = iVar10;
                if (uVar12 <= puVar6[iVar8]) break;
                iVar15 = iVar10 * 2;
                iVar8 = iVar1 + iVar10 * 2;
                iVar9 = iVar4 + -1;
                iVar10 = iVar15;
              } while (iVar8 < iVar4);
              iVar15 = iVar15 >> 1;
            }
            iVar10 = iVar9;
            if (((puVar6[iVar9] != uVar12) && (iVar10 = iVar4, uVar12 <= puVar6[iVar9])) &&
               (iVar10 = iVar9, iVar15 + iVar1 + 1 != iVar9)) {
              iVar15 = iVar15 + iVar1;
              do {
                iVar10 = iVar15 + iVar9 >> 1;
                if (puVar6[iVar10] == uVar12) break;
                iVar8 = iVar10;
                if (uVar12 <= puVar6[iVar10]) {
                  iVar8 = iVar15;
                  iVar9 = iVar10;
                }
                iVar15 = iVar8;
                iVar10 = iVar9;
              } while (iVar15 + 1 != iVar9);
            }
          }
        }
        else {
          _Var16 = true;
LAB_0011ece9:
          bVar7 = false;
          iVar10 = iVar8;
        }
        iVar8 = iVar10;
      } while (bVar7);
    }
  }
  return _Var16;
}

Assistant:

bool array_run_container_intersect(const array_container_t *src_1,
                                   const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return !array_container_empty(src_1);
    }
    if (src_2->n_runs == 0) {
        return false;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return false;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            return true;
        }
    }
    return false;
}